

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdcat.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  bsdcat *bsdcat;
  bsdcat bsdcat_storage;
  bsdcat local_48;
  
  local_48.argc = 0;
  local_48._20_4_ = 0;
  local_48.argv = (char **)0x0;
  local_48.getopt_state = 0;
  local_48._4_4_ = 0;
  local_48.getopt_word = (char *)0x0;
  local_48.argument = (char *)0x0;
  lafe_setprogname(*argv,"bsdcat");
  local_48.argc = argc;
  local_48.argv = argv;
  iVar1 = bsdcat_getopt(&local_48);
  if (iVar1 == -1) {
    bsdcat_next();
    if (*local_48.argv == (char *)0x0) {
      bsdcat_current_path = "<stdin>";
      bsdcat_read_to_stdout((char *)0x0);
    }
    else {
      while (*local_48.argv != (char *)0x0) {
        bsdcat_current_path = *local_48.argv;
        local_48.argv = local_48.argv + 1;
        bsdcat_read_to_stdout(bsdcat_current_path);
        bsdcat_next();
      }
      archive_read_free(a);
    }
    exit((uint)exit_status);
  }
  if (iVar1 != 0) {
    if (iVar1 == 0x68) {
      usage(_stdout,0);
    }
    usage(_stderr,1);
  }
  version();
}

Assistant:

int
main(int argc, char **argv)
{
	struct bsdcat *bsdcat, bsdcat_storage;
	int c;

	bsdcat = &bsdcat_storage;
	memset(bsdcat, 0, sizeof(*bsdcat));

	lafe_setprogname(*argv, "bsdcat");

	bsdcat->argv = argv;
	bsdcat->argc = argc;

	while ((c = bsdcat_getopt(bsdcat)) != -1) {
		switch (c) {
		case 'h':
			usage(stdout, 0);
			/* NOTREACHED */
			/* Fallthrough */
		case OPTION_VERSION:
			version();
			/* NOTREACHED */
			/* Fallthrough */
		default:
			usage(stderr, 1);
			/* Fallthrough */
			/* NOTREACHED */
		}
	}

	bsdcat_next();
	if (*bsdcat->argv == NULL) {
		bsdcat_current_path = "<stdin>";
		bsdcat_read_to_stdout(NULL);
	} else {
		while (*bsdcat->argv) {
			bsdcat_current_path = *bsdcat->argv++;
			bsdcat_read_to_stdout(bsdcat_current_path);
			bsdcat_next();
		}
		archive_read_free(a); /* Help valgrind & friends */
	}

	exit(exit_status);
}